

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O2

void If_CutRotatePins(If_Man_t *p,If_Cut_t *pCut)

{
  byte bVar1;
  float fVar2;
  word *pOut;
  uint __line;
  int iVar3;
  int c;
  ulong uVar4;
  word *pIn;
  int nVars;
  void **in_RDX;
  ulong uVar5;
  char *__assertion;
  float PinDelays [32];
  
  if (p->pPars->fUseTtPerm != 0) {
    __assertion = "!p->pPars->fUseTtPerm";
    __line = 0x48;
LAB_00373784:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                  ,__line,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
  }
  bVar1 = pCut->field_0x1f;
  uVar5 = (ulong)bVar1;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    fVar2 = (&pCut[1].Area)[uVar4];
    if (((long)(int)fVar2 < 0) || (p->vObjs->nSize <= (int)fVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    in_RDX = p->vObjs->pArray;
    if (in_RDX[(int)fVar2] == (void *)0x0) break;
    PinDelays[uVar4] = *(float *)((long)in_RDX[(int)fVar2] + 0x5c);
  }
  if (p->vTtMem[uVar5] == (Vec_Mem_t *)0x0) {
    If_CutTruthPermute((word *)0x0,(uint)bVar1,(int)in_RDX,p->nTruth6Words[uVar5],PinDelays,
                       (int *)(pCut + 1));
  }
  else {
    pOut = p->puTempW;
    pIn = If_CutTruthWR(p,pCut);
    Abc_TtCopy(pOut,pIn,p->nTruth6Words[(byte)pCut->field_0x1f],0);
    If_CutTruthPermute(p->puTempW,(uint)(byte)pCut->field_0x1f,nVars,
                       p->nTruth6Words[(byte)pCut->field_0x1f],PinDelays,(int *)(pCut + 1));
    iVar3 = Vec_MemHashInsert(p->vTtMem[(byte)pCut->field_0x1f],p->puTempW);
    if (pCut->iCutFunc < 0) {
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/if.h"
                    ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
    }
    c = Abc_LitIsCompl(pCut->iCutFunc);
    iVar3 = Abc_Var2Lit(iVar3,c);
    pCut->iCutFunc = iVar3;
    if ((*p->puTempW & 1) != 0) {
      __assertion = "(p->puTempW[0] & 1) == 0";
      __line = 0x54;
      goto LAB_00373784;
    }
  }
  return;
}

Assistant:

void If_CutRotatePins( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float PinDelays[IF_MAX_LUTSIZE];
    int i, truthId;
    assert( !p->pPars->fUseTtPerm );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        PinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    if ( p->vTtMem[pCut->nLeaves] == NULL )
    {
        If_CutTruthPermute( NULL, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
        return;
    }
    Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], 0 );
    If_CutTruthPermute( p->puTempW, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], p->puTempW );
    pCut->iCutFunc = Abc_Var2Lit( truthId, If_CutTruthIsCompl(pCut) );
    assert( (p->puTempW[0] & 1) == 0 );
}